

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Printer.h
# Opt level: O2

void __thiscall soul::heart::Printer::PrinterStream::printValue(PrinterStream *this,Value *v)

{
  Category CVar1;
  Primitive PVar2;
  CodePrinter *pCVar3;
  Printer p;
  string local_40;
  
  pCVar3 = this->out;
  p.super_ValuePrinter.dictionary = (StringDictionary *)0x0;
  p.super_ValuePrinter._vptr_ValuePrinter = (_func_int **)&PTR__ValuePrinter_002fc860;
  PVar2 = (v->type).primitiveType.type;
  CVar1 = (v->type).category;
  p.outStream = pCVar3;
  if ((1 < PVar2 - int32 || CVar1 != primitive) &&
     ((PVar2 & ~void_) != float32 || CVar1 != primitive)) {
    getTypeDescription_abi_cxx11_(&local_40,this,&v->type);
    pCVar3 = choc::text::CodePrinter::operator<<(pCVar3,&local_40);
    choc::text::CodePrinter::operator<<(pCVar3,' ');
    std::__cxx11::string::~string((string *)&local_40);
    p.super_ValuePrinter.dictionary = &((this->module->program).pimpl)->stringDictionary;
  }
  soul::Value::print(v,&p.super_ValuePrinter);
  return;
}

Assistant:

void printValue (const Value& v)
        {
            struct Printer  : public ValuePrinter
            {
                Printer (choc::text::CodePrinter& s) : outStream (s) {}

                void print (std::string_view s) override    { outStream << s; }
                void printFloat32 (float value) override    { if (value == 0) print ("0.0f"); else ValuePrinter::printFloat32 (value); }
                void printFloat64 (double value) override   { if (value == 0) print ("0.0");  else ValuePrinter::printFloat64 (value); }

                void printStringLiteral (StringDictionary::Handle h) override
                {
                    print (dictionary != nullptr ? toHeartStringLiteral (dictionary->getStringForHandle (h))
                                                 : std::to_string (h.handle));
                }

                choc::text::CodePrinter& outStream;
            };

            Printer p { out };

            if (! (v.getType().isPrimitiveInteger() || v.getType().isPrimitiveFloat()))
            {
                out << getTypeDescription (v.getType()) << ' ';
                p.dictionary = std::addressof (module.program.getStringDictionary());
            }

            v.print (p);
        }